

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

double calc_kf_frame_boost(PRIMARY_RATE_CONTROL *p_rc,FRAME_INFO *frame_info,
                          FIRSTPASS_STATS *this_frame,double *sr_accumulator,double max_boost)

{
  double *in_RCX;
  long in_RDX;
  FRAME_INFO *in_RSI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double active_area;
  double boost_q_correction;
  double lq;
  double frame_boost;
  FIRSTPASS_STATS *in_stack_ffffffffffffff88;
  FRAME_INFO *in_stack_ffffffffffffff90;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_50;
  
  dVar1 = av1_convert_qindex_to_q
                    ((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (aom_bit_depth_t)in_stack_ffffffffffffff88);
  if (2.0 <= dVar1 * 0.015 + 0.5) {
    local_50 = 2.0;
  }
  else {
    local_50 = dVar1 * 0.015 + 0.5;
  }
  dVar1 = calculate_active_area(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  dVar2 = baseline_err_per_mb(in_RSI);
  if (dVar2 * dVar1 <= *(double *)(in_RDX + 0x10) * dVar1) {
    local_58 = *(double *)(in_RDX + 0x10);
  }
  else {
    local_58 = baseline_err_per_mb(in_RSI);
  }
  local_58 = local_58 * dVar1;
  if (0.0 <= (*(double *)(in_RDX + 0x20) + *in_RCX) * dVar1) {
    local_68 = (*(double *)(in_RDX + 0x20) + *in_RCX) * dVar1 + 1e-06;
  }
  else {
    local_68 = (*(double *)(in_RDX + 0x20) + *in_RCX) * dVar1 + -1e-06;
  }
  *in_RCX = (*(double *)(in_RDX + 0x28) - *(double *)(in_RDX + 0x20)) + *in_RCX;
  if (0.0 < *in_RCX || *in_RCX == 0.0) {
    dVar1 = *in_RCX;
  }
  else {
    dVar1 = 0.0;
  }
  *in_RCX = dVar1;
  dVar1 = (local_58 / local_68 + 40.0) * local_50;
  if (in_XMM0_Qa * local_50 <= dVar1) {
    dVar1 = in_XMM0_Qa * local_50;
  }
  return dVar1;
}

Assistant:

static double calc_kf_frame_boost(const PRIMARY_RATE_CONTROL *p_rc,
                                  const FRAME_INFO *frame_info,
                                  const FIRSTPASS_STATS *this_frame,
                                  double *sr_accumulator, double max_boost) {
  double frame_boost;
  const double lq = av1_convert_qindex_to_q(p_rc->avg_frame_qindex[INTER_FRAME],
                                            frame_info->bit_depth);
  const double boost_q_correction = AOMMIN((0.50 + (lq * 0.015)), 2.00);
  const double active_area = calculate_active_area(frame_info, this_frame);

  // Underlying boost factor is based on inter error ratio.
  frame_boost = AOMMAX(baseline_err_per_mb(frame_info) * active_area,
                       this_frame->intra_error * active_area) /
                DOUBLE_DIVIDE_CHECK(
                    (this_frame->coded_error + *sr_accumulator) * active_area);

  // Update the accumulator for second ref error difference.
  // This is intended to give an indication of how much the coded error is
  // increasing over time.
  *sr_accumulator += (this_frame->sr_coded_error - this_frame->coded_error);
  *sr_accumulator = AOMMAX(0.0, *sr_accumulator);

  // Q correction and scaling
  // The 40.0 value here is an experimentally derived baseline minimum.
  // This value is in line with the minimum per frame boost in the alt_ref
  // boost calculation.
  frame_boost = ((frame_boost + 40.0) * boost_q_correction);

  return AOMMIN(frame_boost, max_boost * boost_q_correction);
}